

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

void lyb_skip_siblings(lylyb_ctx *lybctx)

{
  long local_48;
  long local_38;
  long local_28;
  lylyb_ctx *lybctx_local;
  
  do {
    if (lybctx->siblings == (lyd_lyb_sibling *)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = *(long *)&lybctx->siblings[-1].inner_chunks;
    }
    ly_in_skip(lybctx->in,(long)(int)((uint)lybctx->siblings[local_28 + -1].inner_chunks << 2));
    if (lybctx->siblings == (lyd_lyb_sibling *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = *(long *)&lybctx->siblings[-1].inner_chunks;
    }
    lyb_read((uint8_t *)0x0,lybctx->siblings[local_38 + -1].written,lybctx);
    if (lybctx->siblings == (lyd_lyb_sibling *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = *(long *)&lybctx->siblings[-1].inner_chunks;
    }
  } while (lybctx->siblings[local_48 + -1].written != 0);
  return;
}

Assistant:

static void
lyb_skip_siblings(struct lylyb_ctx *lybctx)
{
    do {
        /* first skip any meta information inside */
        ly_in_skip(lybctx->in, LYB_LAST_SIBLING(lybctx).inner_chunks * LYB_META_BYTES);

        /* then read data */
        lyb_read(NULL, LYB_LAST_SIBLING(lybctx).written, lybctx);
    } while (LYB_LAST_SIBLING(lybctx).written);
}